

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
GGUFMeta::GKV<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get_kv(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
      gguf_context *ctx,int k)

{
  int iVar1;
  runtime_error *this;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string sStack_48;
  
  iVar1 = gguf_get_kv_type(ctx,(long)k);
  if (iVar1 == 8) {
    GKV_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getter(__return_storage_ptr__,ctx,k);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar2 = gguf_get_key(ctx,(long)k);
  uVar3 = gguf_type_name(iVar1);
  uVar4 = gguf_type_name(8);
  format_abi_cxx11_(&sStack_48,"key %s has wrong type %s but expected type %s",uVar2,uVar3,uVar4);
  std::runtime_error::runtime_error(this,(string *)&sStack_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }